

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckSucceedsOnTrue::~TestCheckSucceedsOnTrue
          (TestCheckSucceedsOnTrue *this)

{
  TestCheckSucceedsOnTrue *this_local;
  
  ~TestCheckSucceedsOnTrue(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckSucceedsOnTrue)
{
    bool failure = true;
    {
        RecordingReporter reporter;
        UnitTest::TestResults testResults(&reporter);

		ScopedCurrentTest scopedResults(testResults);
		CHECK(true);

		failure = (testResults.GetFailureCount() > 0);
    }

    CHECK(!failure);
}